

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
::~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
           *this)

{
  ~CartesianProductGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

~CartesianProductGenerator() override {}